

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool caffe::HingeLossParameter_Norm_IsValid(int value)

{
  bool local_9;
  int value_local;
  
  local_9 = value == 1 || value == 2;
  return local_9;
}

Assistant:

bool HingeLossParameter_Norm_IsValid(int value) {
  switch (value) {
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}